

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O2

void burstsort_mkq_recursiveburst_2(uchar **strings,size_t N)

{
  ushort uVar1;
  unsigned_short *__ptr;
  ushort uVar2;
  uint16_t uVar3;
  uint uVar4;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *p_Var5;
  TSTNode<unsigned_short> *pTVar6;
  uint uVar7;
  pointer ppuVar8;
  size_t sVar9;
  size_t depth;
  ulong uVar10;
  pointer ppuVar11;
  BurstRecursive<unsigned_short> local_91;
  TSTNode<unsigned_short> *local_90;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_88;
  uchar **local_80;
  unsigned_short *local_78;
  uchar *str;
  size_t local_68;
  size_t local_60;
  TSTNode<unsigned_short> root;
  
  TSTNode<unsigned_short>::TSTNode(&root);
  sVar9 = 0;
  local_80 = strings;
  local_68 = N;
  root.pivot = pseudo_median<unsigned_short>(strings,N,0);
  while( true ) {
    if (sVar9 == local_68) break;
    str = local_80[sVar9];
    uVar2 = get_char<unsigned_short>(str,0);
    pTVar6 = &root;
    depth = 0;
    while( true ) {
      uVar1 = pTVar6->pivot;
      uVar7 = (uint)(uVar2 == uVar1) + (uint)(uVar1 <= uVar2 && uVar2 != uVar1) * 2;
      if (((uint)(pTVar6->is_tst).super__Base_bitset<1UL>._M_w >> uVar7 & 1) == 0) break;
      if (uVar7 == 1) {
        depth = depth + 2;
        uVar2 = get_char<unsigned_short>(str,depth);
      }
      pTVar6 = (TSTNode<unsigned_short> *)(pTVar6->buckets)._M_elems[uVar7];
    }
    p_Var5 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (pTVar6->buckets)._M_elems[uVar7];
    local_60 = sVar9;
    if (p_Var5 == (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
      p_Var5 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18)
      ;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var5->_M_impl)->
      _M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var5->_M_impl)->
      _M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var5->_M_impl)->
      _M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pTVar6->buckets)._M_elems[uVar7] = p_Var5;
    }
    local_88 = p_Var5;
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)p_Var5,&str);
    if ((uVar7 != 1) || ((char)pTVar6->pivot != '\0')) {
      ppuVar11 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                  &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
      ppuVar8 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                 &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_finish;
      if ((0x20000 < (ulong)((long)ppuVar8 - (long)ppuVar11)) &&
         (ppuVar8 ==
          (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&local_88->_M_impl)->
          _M_impl).super__Vector_impl_data._M_end_of_storage)) {
        local_90 = (TSTNode<unsigned_short> *)(depth + 2);
        if (uVar7 != 1) {
          local_90 = (TSTNode<unsigned_short> *)depth;
        }
        local_78 = (unsigned_short *)malloc((long)ppuVar8 - (long)ppuVar11 >> 2);
        for (uVar4 = 0; uVar10 = (ulong)uVar4, uVar10 < (ulong)((long)ppuVar8 - (long)ppuVar11 >> 3)
            ; uVar4 = uVar4 + 1) {
          uVar3 = get_char<unsigned_short>(ppuVar11[uVar10],(size_t)local_90);
          local_78[uVar10] = uVar3;
          ppuVar11 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                      &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
          ppuVar8 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                     &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_finish;
        }
        verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                  (&root,0);
        __ptr = local_78;
        p_Var5 = local_88;
        local_90 = BurstRecursive<unsigned_short>::operator()
                             (&local_91,
                              (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_88,
                              local_78,(size_t)local_90);
        free(__ptr);
        std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(p_Var5);
        operator_delete(p_Var5);
        (pTVar6->buckets)._M_elems[uVar7] = local_90;
        (pTVar6->is_tst).super__Base_bitset<1UL>._M_w =
             (pTVar6->is_tst).super__Base_bitset<1UL>._M_w | 1L << (sbyte)uVar7;
        verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                  (&root,0);
      }
    }
    sVar9 = local_60 + 1;
  }
  verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>(&root,0);
  burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
            (&root,local_80,0,0);
  return;
}

Assistant:

void burstsort_mkq_recursiveburst_2(unsigned char** strings, size_t N)
{ burstsort_mkq_recursiveburst<uint16_t>(strings, N); }